

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O0

string * __thiscall pbrt::FBmTexture::ToString_abi_cxx11_(FBmTexture *this)

{
  string *in_RDI;
  int *in_stack_00000010;
  float *in_stack_00000018;
  TextureMapping3DHandle *in_stack_00000020;
  char *in_stack_00000028;
  
  StringPrintf<pbrt::TextureMapping3DHandle_const&,float_const&,int_const&>
            (in_stack_00000028,in_stack_00000020,in_stack_00000018,in_stack_00000010);
  return in_RDI;
}

Assistant:

std::string FBmTexture::ToString() const {
    return StringPrintf("[ FBmTexture mapping: %s omega: %f octaves: %d ]", mapping,
                        omega, octaves);
}